

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcICheck.c
# Opt level: O3

void Bmc_PerformFindFlopOrder_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vRegs)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  int Entry;
  
  pGVar1 = p->pObjs;
  if (pGVar1 <= pObj) {
    do {
      if (pGVar1 + p->nObjs <= pObj) break;
      Entry = (int)((long)pObj - (long)pGVar1 >> 2) * -0x55555555;
      if (p->nTravIdsAlloc <= Entry) {
        __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x263,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
      }
      if (p->pTravIds[Entry] == p->nTravIds) {
        return;
      }
      p->pTravIds[Entry] = p->nTravIds;
      uVar2 = (uint)*(undefined8 *)pObj;
      if ((~uVar2 & 0x9fffffff) == 0) {
        if ((int)((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff) <
            p->vCis->nSize - p->nRegs) {
          return;
        }
        if (pObj < pGVar1 + p->nObjs) {
          Vec_IntPush(vRegs,Entry);
          return;
        }
        break;
      }
      if (((int)uVar2 < 0) || ((uVar2 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcICheck.c"
                      ,0x13e,
                      "void Bmc_PerformFindFlopOrder_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
      }
      Bmc_PerformFindFlopOrder_rec(p,pObj + -(ulong)(uVar2 & 0x1fffffff),vRegs);
      pObj = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
      pGVar1 = p->pObjs;
    } while (pGVar1 <= pObj);
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Bmc_PerformFindFlopOrder_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vRegs )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
    {
        if ( Gia_ObjIsRo(p, pObj) )
            Vec_IntPush( vRegs, Gia_ObjId(p, pObj) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Bmc_PerformFindFlopOrder_rec( p, Gia_ObjFanin0(pObj), vRegs );
    Bmc_PerformFindFlopOrder_rec( p, Gia_ObjFanin1(pObj), vRegs );
}